

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void __thiscall counting_list<unsigned_char_*>::clear(counting_list<unsigned_char_*> *this)

{
  this->_size = 0;
  std::__cxx11::list<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
            (&this->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  return;
}

Assistant:

void clear()
	{
		_size = 0;
		std::list<T>::clear();
	}